

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::submit
          (BufferCopyToImage *this,SubmitContext *context)

{
  DeviceInterface *pDVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  undefined4 local_10;
  undefined8 local_c;
  undefined4 local_4;
  
  pDVar1 = context->m_context->m_context->m_vkd;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 1;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 1;
  local_18 = 0;
  local_10 = 0;
  local_c._0_4_ = this->m_imageWidth;
  local_c._4_4_ = this->m_imageHeight;
  local_4 = 1;
  (*pDVar1->_vptr_DeviceInterface[0x62])
            (pDVar1,context->m_commandBuffer,
             (context->m_context->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
             m_data.object.m_internal,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,7,1,&local_38);
  return;
}

Assistant:

void BufferCopyToImage::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();
	const vk::VkBufferImageCopy	region			=
	{
		0,
		0, 0,
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{ 0, 0, 0 },
		{
			(deUint32)m_imageWidth,
			(deUint32)m_imageHeight,
			1u
		}
	};

	vkd.cmdCopyBufferToImage(commandBuffer, context.getBuffer(), *m_dstImage, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &region);
}